

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigmund~.c
# Opt level: O3

void sigmund_getpitch(int npeak,t_peak_conflict *peakv,t_float *freqp,t_float npts,t_float srate,
                     t_float nharmonics,t_float amppower,int loud)

{
  float fVar1;
  bool bVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  t_float *ptVar8;
  t_peak_conflict *ptVar9;
  t_peak_conflict *ptVar10;
  uint uVar11;
  void *__s;
  int iVar12;
  float fVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  float fVar17;
  float fVar18;
  int iVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  t_peak_conflict *bigpeaks [12];
  ulong local_50;
  
  uVar4 = (uint)npts;
  uVar11 = 0xffffffd0;
  if (uVar4 != 0) {
    do {
      uVar11 = uVar11 + 0x30;
      bVar2 = 1 < uVar4;
      uVar4 = (int)uVar4 >> 1;
    } while (bVar2);
  }
  uVar5 = (long)(int)uVar11 << 2;
  if (0xffff < uVar5) {
    uVar5 = 0x10000;
  }
  lVar3 = -(ulong)((int)uVar5 + 0xfU & 0x3fff0);
  __s = (void *)((long)bigpeaks + lVar3 + -8);
  if (npeak < 1) {
    fVar13 = 0.0;
  }
  else {
    fVar18 = (srate * 0.5) / npts;
    if (0 < (int)uVar11) {
      *(undefined8 *)((long)&uStack_f0 + lVar3) = 0x1b328b;
      memset(__s,0,(ulong)uVar11 * 4);
    }
    ptVar8 = &peakv->p_tmp;
    uVar5 = (ulong)(uint)npeak;
    do {
      *ptVar8 = 0.0;
      ptVar8[-1] = ptVar8[-3] * -0.0 + ptVar8[-2];
      ptVar8 = ptVar8 + 8;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
    local_50 = 0;
    do {
      ptVar9 = (t_peak_conflict *)0x0;
      uVar5 = (ulong)(uint)npeak;
      ptVar10 = peakv;
      fVar13 = -1e+20;
      do {
        if (((ptVar10->p_tmp == 0.0) && (!NAN(ptVar10->p_tmp))) && (fVar13 < ptVar10->p_salience)) {
          ptVar9 = ptVar10;
          fVar13 = ptVar10->p_salience;
        }
        ptVar10 = ptVar10 + 1;
        uVar5 = uVar5 - 1;
      } while (uVar5 != 0);
      if (ptVar9 == (t_peak_conflict *)0x0) {
        if (local_50 != 0) goto LAB_001b335d;
        dVar14 = 0.0;
        bVar2 = true;
        local_50 = 0;
        goto LAB_001b34ac;
      }
      bigpeaks[local_50 - 1] = ptVar9;
      ptVar9->p_tmp = 1.0;
      local_50 = local_50 + 1;
    } while (local_50 != 0xc);
    local_50 = 0xc;
LAB_001b335d:
    local_50 = local_50 & 0xffffffff;
    fVar13 = 0.0;
    uVar5 = 0;
    do {
      ptVar9 = bigpeaks[uVar5 - 1];
      fVar17 = ptVar9->p_freq;
      *(undefined8 *)((long)&uStack_f0 + lVar3) = 0x1b33ab;
      dVar14 = log((double)fVar17 / ((double)fVar18 + (double)fVar18));
      fVar17 = ptVar9->p_amp;
      *(undefined8 *)((long)&uStack_f0 + lVar3) = 0x1b33cf;
      dVar15 = pow((double)fVar17,(double)amppower);
      iVar19 = 0;
      do {
        iVar12 = iVar19 + 1;
        *(undefined8 *)((long)&uStack_f0 + lVar3) = 0x1b3404;
        dVar16 = log((double)iVar12);
        uVar4 = (uint)((float)(dVar16 * -69.24936196267028 +
                              (double)(float)(dVar14 * 69.24936196267028)) + -0.5);
        if ((int)uVar4 < -2) break;
        if ((int)(uVar4 + 2) < (int)uVar11) {
          uVar6 = (ulong)uVar4;
          if ((int)uVar4 < 1) {
            uVar6 = 0;
          }
          uVar6 = uVar6 - 1;
          do {
            *(float *)((long)bigpeaks + uVar6 * 4 + lVar3 + -4) =
                 *(float *)((long)bigpeaks + uVar6 * 4 + lVar3 + -4) +
                 ((float)dVar15 * nharmonics) / ((float)iVar19 + nharmonics);
            uVar6 = uVar6 + 1;
          } while (uVar6 < uVar4 + 2);
        }
        iVar19 = iVar12;
      } while (iVar12 != 0x10);
      fVar13 = fVar13 + (float)dVar15;
      uVar5 = uVar5 + 1;
    } while (uVar5 != local_50);
    dVar14 = (double)fVar13 * 0.4;
    bVar2 = false;
LAB_001b34ac:
    if ((int)uVar11 < 1) {
      dVar15 = -1.0000000200408773e+20;
      fVar13 = -1.0;
    }
    else {
      fVar13 = -1.0;
      uVar5 = 0;
      fVar17 = -1e+20;
      do {
        fVar1 = *(float *)((long)__s + uVar5 * 4);
        fVar22 = fVar1;
        if (fVar1 <= fVar17) {
          fVar22 = fVar17;
        }
        fVar13 = (float)(~-(uint)(fVar17 < fVar1) & (uint)fVar13 |
                        (uint)(float)(int)uVar5 & -(uint)(fVar17 < fVar1));
        uVar5 = uVar5 + 1;
        fVar17 = fVar22;
      } while (uVar11 != uVar5);
      dVar15 = (double)fVar22;
    }
    fVar17 = -1.0;
    if (dVar14 <= dVar15) {
      fVar17 = fVar13;
    }
    fVar13 = 0.0;
    if (0.0 <= fVar17) {
      if ((0.0 < fVar17) && (fVar17 < (float)(int)(uVar11 - 1))) {
        lVar7 = (long)(int)fVar17;
        fVar13 = *(float *)((long)&uStack_f0 + lVar7 * 4 + lVar3 + 4);
        fVar1 = *(float *)((long)bigpeaks + lVar7 * 4 + lVar3 + -4);
        fVar17 = fVar17 + (fVar1 - fVar13) / (fVar1 + *(float *)((long)__s + lVar7 * 4) + fVar13);
      }
      *(undefined8 *)((long)&uStack_f0 + lVar3) = 0x1b358d;
      dVar14 = exp((double)fVar17 * 0.01444056626166552);
      fVar13 = (float)(dVar14 * (double)(fVar18 + fVar18));
      if (!bVar2) {
        fVar18 = 0.0;
        uVar5 = 0;
        fVar17 = 0.0;
        do {
          fVar1 = bigpeaks[uVar5 - 1]->p_freq;
          fVar21 = fVar1 / fVar13;
          fVar22 = fVar21 + 0.5;
          if ((int)fVar22 - 1U < 0x10) {
            iVar19 = (int)fVar22;
            fVar20 = (float)iVar19;
            fVar21 = fVar21 - fVar20;
            fVar22 = (float)iVar19 * 0.015;
            if ((fVar21 < fVar22) && (-fVar22 < fVar21)) {
              fVar22 = bigpeaks[uVar5 - 1]->p_amp * fVar20;
              fVar18 = fVar18 + fVar22;
              fVar17 = fVar17 + (fVar1 * fVar22) / fVar20;
            }
          }
          uVar5 = uVar5 + 1;
        } while (local_50 != uVar5);
        if (0.0 < fVar18) {
          fVar13 = fVar17 / fVar18;
        }
      }
    }
  }
  *freqp = (t_float)(-(uint)(!NAN(fVar13) && !NAN(fVar13)) & (uint)fVar13);
  return;
}

Assistant:

static void sigmund_getpitch(int npeak, t_peak *peakv, t_float *freqp,
    t_float npts, t_float srate, t_float nharmonics, t_float amppower, int loud)
{
    t_float fperbin = 0.5 * srate / npts;
    int npit = 48 * sigmund_ilog2(npts), i, j, k, nsalient;
    t_float bestbin, bestweight, sumamp, sumweight, sumfreq, freq;
    t_float *weights =  0;
    t_peak *bigpeaks[PITCHNPEAK];
    size_t weight_len = sizeof(t_float) * npit;
    if(weight_len > 65536)
      weight_len = 65536;
    weights = (t_float *)alloca(weight_len);
    if (npeak < 1)
    {
        freq = 0;
        goto done;
    }
    for (i = 0; i < npit; i++)
        weights[i] = 0;
    for (i = 0; i < npeak; i++)
    {
        peakv[i].p_tmp = 0;
        peakv[i].p_salience = peakv[i].p_db - DBPERHALFTONE * peakv[i].p_pit;
    }
    for (nsalient = 0; nsalient < PITCHNPEAK; nsalient++)
    {
        t_peak *bestpeak = 0;
        t_float bestsalience = -1e20;
        for (j = 0; j < npeak; j++)
            if (peakv[j].p_tmp == 0 && peakv[j].p_salience > bestsalience)
        {
            bestsalience = peakv[j].p_salience;
            bestpeak = &peakv[j];
        }
        if (!bestpeak)
            break;
        bigpeaks[nsalient] = bestpeak;
        bestpeak->p_tmp = 1;
        /* post("peak f=%f a=%f", bestpeak->p_freq, bestpeak->p_amp); */
    }
    sumweight = 0;
    for (i = 0; i < nsalient; i++)
    {
        t_peak *thispeak = bigpeaks[i];
        t_float weightindex = (48./LOG2) *
            log(thispeak->p_freq/(2.*fperbin));
        t_float loudness = pow(thispeak->p_amp, amppower);
        /* post("index %f, uncertainty %f", weightindex, pitchuncertainty); */
        for (j = 0; j < SUBHARMONICS; j++)
        {
            t_float subindex = weightindex -
                (48./LOG2) * log(j + 1.);
            int loindex = subindex - 0.5;
            int hiindex = loindex+2;
            if (hiindex < 0)
                break;
            if (hiindex >= npit)
                continue;
            if (loindex < 0)
                loindex = 0;
            for (k = loindex; k <= hiindex; k++)
                weights[k] += loudness * nharmonics / (nharmonics + j);
        }
        sumweight += loudness;
    }
    bestbin = -1;
    bestweight = -1e20;
    for (i = 0; i < npit; i++)
        if (weights[i] > bestweight)
            bestweight = weights[i], bestbin = i;
    if (bestweight < sumweight * 0.4)
        bestbin = -1;
    
    if (bestbin < 0)
    {
        freq = 0;
        goto done;
    }
    if (bestbin > 0 && bestbin < npit-1)
    {
        int ibest = bestbin;
        bestbin += (weights[ibest+1] - weights[ibest-1]) /
            (weights[ibest+1] +  weights[ibest] + weights[ibest-1]);
    }
    freq = 2*fperbin * exp((LOG2/48.)*bestbin);
    for (sumamp = sumweight = sumfreq = 0, i = 0; i < nsalient; i++)
    {
        t_peak *thispeak = bigpeaks[i];
        t_float thisloudness = thispeak->p_amp;
        t_float thisfreq = thispeak->p_freq;
        t_float harmonic = thisfreq/freq;
        t_float intpart = (int)(0.5 + harmonic);
        t_float inharm = harmonic - intpart;
#if 0
        if (loud)
            post("freq %f intpart %f inharm %f", freq, intpart, inharm);
#endif
        if (intpart >= 1 && intpart <= 16 &&
            inharm < 0.015 * intpart && inharm > - (0.015 * intpart))
        {
            t_float weight = thisloudness * intpart;
            sumweight += weight;
            sumfreq += weight*thisfreq/intpart;
#if 0
            if (loud)
                post("weight %f freq %f", weight, thisfreq);
#endif
        }
    }
    if (sumweight > 0)
        freq = sumfreq / sumweight;
done:
    if (!(freq >= 0 || freq <= 0))
    {
        /* post("freq nan cancelled"); */
        freq = 0;
    }
    *freqp = freq;
}